

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Glucose::SimpSolver::SimpSolver(SimpSolver *this,SimpSolver *s)

{
  CRef CVar1;
  long in_RSI;
  undefined8 *in_RDI;
  vec<Glucose::Lit> dummy;
  Solver *in_stack_000000b8;
  Solver *in_stack_000000c0;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  vec<char> *this_00;
  undefined2 uVar2;
  ClauseDeleted *in_stack_ffffffffffffff88;
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *copy;
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>
  *in_stack_ffffffffffffff90;
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *this_01;
  ElimLt local_30;
  ClauseDeleted local_28 [3];
  long local_10;
  
  local_10 = in_RSI;
  Solver::Solver(in_stack_000000c0,in_stack_000000b8);
  *in_RDI = &PTR_clone_0013dd10;
  *(undefined4 *)((long)in_RDI + 0x4ac) = *(undefined4 *)(local_10 + 0x4ac);
  *(undefined4 *)(in_RDI + 0x96) = *(undefined4 *)(local_10 + 0x4b0);
  *(undefined4 *)((long)in_RDI + 0x4b4) = *(undefined4 *)(local_10 + 0x4b4);
  in_RDI[0x97] = *(undefined8 *)(local_10 + 0x4b8);
  *(byte *)(in_RDI + 0x98) = *(byte *)(local_10 + 0x4c0) & 1;
  *(byte *)((long)in_RDI + 0x4c1) = *(byte *)(local_10 + 0x4c1) & 1;
  *(byte *)((long)in_RDI + 0x4c2) = *(byte *)(local_10 + 0x4c2) & 1;
  *(undefined4 *)((long)in_RDI + 0x4c4) = *(undefined4 *)(local_10 + 0x4c4);
  *(undefined4 *)(in_RDI + 0x99) = *(undefined4 *)(local_10 + 0x4c8);
  *(undefined4 *)((long)in_RDI + 0x4cc) = *(undefined4 *)(local_10 + 0x4cc);
  *(byte *)(in_RDI + 0x9a) = *(byte *)(local_10 + 0x4d0) & 1;
  *(undefined4 *)((long)in_RDI + 0x4d4) = *(undefined4 *)(local_10 + 0x4d4);
  vec<unsigned_int>::vec((vec<unsigned_int> *)(in_RDI + 0x9b));
  vec<char>::vec((vec<char> *)(in_RDI + 0x9d));
  ClauseDeleted::ClauseDeleted(local_28,(ClauseAllocator *)(in_RDI + 0x68));
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::OccLists
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  vec<int>::vec((vec<int> *)(in_RDI + 0xa6));
  this_01 = (OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *)
            (in_RDI + 0xa8);
  ElimLt::ElimLt(&local_30,(vec<int> *)(in_RDI + 0xa6));
  Heap<Glucose::SimpSolver::ElimLt>::Heap
            ((Heap<Glucose::SimpSolver::ElimLt> *)this_01,(ElimLt *)in_stack_ffffffffffffff88);
  copy = (OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *)
         (in_RDI + 0xad);
  Queue<unsigned_int>::Queue
            ((Queue<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  this_00 = (vec<char> *)(in_RDI + 0xb0);
  vec<char>::vec(this_00);
  uVar2 = (undefined2)((ulong)this_00 >> 0x30);
  vec<char>::vec((vec<char> *)(in_RDI + 0xb2));
  *(undefined4 *)(in_RDI + 0xb4) = *(undefined4 *)(local_10 + 0x5a0);
  *(undefined4 *)((long)in_RDI + 0x5a4) = *(undefined4 *)(local_10 + 0x5a4);
  vec<Glucose::Lit>::vec
            ((vec<Glucose::Lit> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff6c,(Lit *)0x12cdc8);
  *(undefined1 *)((long)in_RDI + 0x354) = 1;
  CVar1 = ClauseAllocator::alloc<Glucose::vec<Glucose::Lit>>
                    ((ClauseAllocator *)this_01,(vec<Glucose::Lit> *)copy,
                     SUB21((ushort)uVar2 >> 8,0),SUB21(uVar2,0));
  *(CRef *)(in_RDI + 0xb5) = CVar1;
  *(undefined1 *)(in_RDI + 99) = 0;
  vec<unsigned_int>::memCopyTo
            ((vec<unsigned_int> *)CONCAT44(CVar1,in_stack_ffffffffffffff70),
             (vec<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  vec<char>::memCopyTo
            ((vec<char> *)CONCAT44(CVar1,in_stack_ffffffffffffff70),
             (vec<char> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::copyTo
            (this_01,copy);
  vec<int>::memCopyTo((vec<int> *)CONCAT44(CVar1,in_stack_ffffffffffffff70),
                      (vec<int> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  Heap<Glucose::SimpSolver::ElimLt>::copyTo
            ((Heap<Glucose::SimpSolver::ElimLt> *)CONCAT44(CVar1,in_stack_ffffffffffffff70),
             (Heap<Glucose::SimpSolver::ElimLt> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  Queue<unsigned_int>::copyTo
            ((Queue<unsigned_int> *)CONCAT44(CVar1,in_stack_ffffffffffffff70),
             (Queue<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  vec<char>::memCopyTo
            ((vec<char> *)CONCAT44(CVar1,in_stack_ffffffffffffff70),
             (vec<char> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  vec<char>::memCopyTo
            ((vec<char> *)CONCAT44(CVar1,in_stack_ffffffffffffff70),
             (vec<char> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  *(byte *)(in_RDI + 0x9a) = *(byte *)(local_10 + 0x4d0) & 1;
  *(undefined4 *)(in_RDI + 0xb4) = *(undefined4 *)(local_10 + 0x5a0);
  *(undefined4 *)((long)in_RDI + 0x5a4) = *(undefined4 *)(local_10 + 0x5a4);
  *(undefined4 *)(in_RDI + 0xb5) = *(undefined4 *)(local_10 + 0x5a8);
  *(undefined4 *)(in_RDI + 0x59) = *(undefined4 *)(local_10 + 0x2c8);
  *(byte *)(in_RDI + 0x27) = *(byte *)(local_10 + 0x138) & 1;
  vec<Glucose::Lit>::~vec((vec<Glucose::Lit> *)0x12cfa2);
  return;
}

Assistant:

SimpSolver::SimpSolver(const SimpSolver &s) : Solver(s)
  , grow               (s.grow)
  , clause_lim         (s.clause_lim)
  , subsumption_lim    (s.subsumption_lim)
  , simp_garbage_frac  (s.simp_garbage_frac)
  , use_asymm          (s.use_asymm)
  , use_rcheck         (s.use_rcheck)
  , use_elim           (s.use_elim)
  , merges             (s.merges)
  , asymm_lits         (s.asymm_lits)
  , eliminated_vars    (s.eliminated_vars)
  , use_simplification (s.use_simplification)
  , elimorder          (s.elimorder)
  , occurs             (ClauseDeleted(ca))
  , elim_heap          (ElimLt(n_occ))
  , bwdsub_assigns     (s.bwdsub_assigns)
  , n_touched          (s.n_touched)
{
    // TODO: Copy dummy... what is it???
    vec<Lit> dummy(1,lit_Undef);
    ca.extra_clause_field = true; // NOTE: must happen before allocating the dummy clause below.
    bwdsub_tmpunit        = ca.alloc(dummy);
    remove_satisfied      = false;
    //End TODO  
    

    s.elimclauses.memCopyTo(elimclauses);
    s.touched.memCopyTo(touched);
    s.occurs.copyTo(occurs);
    s.n_occ.memCopyTo(n_occ);
    s.elim_heap.copyTo(elim_heap);
    s.subsumption_queue.copyTo(subsumption_queue);
    s.frozen.memCopyTo(frozen);
    s.eliminated.memCopyTo(eliminated);

    use_simplification = s.use_simplification;
    bwdsub_assigns = s.bwdsub_assigns;
    n_touched = s.n_touched;
    bwdsub_tmpunit = s.bwdsub_tmpunit;
    qhead = s.qhead;
    ok = s.ok;
}